

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataSource.cpp
# Opt level: O3

bool __thiscall csv::icu::StringDataSource::next(StringDataSource *this)

{
  short sVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  undefined1 *puVar5;
  uint uVar6;
  
  iVar2 = this->_offset;
  uVar3 = iVar2 + 1;
  this->_offset = uVar3;
  sVar1 = *(short *)&this->field_0x68;
  if (sVar1 < 0) {
    uVar4 = *(uint *)&this->field_0x6c;
  }
  else {
    uVar4 = (int)sVar1 >> 5;
  }
  if ((int)uVar3 < (int)uVar4) {
    (this->super_DataSource)._prev = (this->super_DataSource)._current;
    uVar6 = 0xffff;
    if (uVar3 < uVar4) {
      if (((int)sVar1 & 2U) == 0) {
        puVar5 = *(undefined1 **)&this->field_0x78;
      }
      else {
        puVar5 = &this->field_0x6a;
      }
      uVar6 = (uint)*(ushort *)(puVar5 + (long)iVar2 * 2 + 2);
    }
    (this->super_DataSource)._current = uVar6;
  }
  return (int)uVar3 < (int)uVar4;
}

Assistant:

bool StringDataSource::next() {
		_offset++;
		if (_offset >= _in.length()) {
			return false;
		}

		_prev = _current;
		_current = _in[_offset];
		return true;
	}